

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall crnlib::crn_comp::pack_data_models(crn_comp *this)

{
  uchar *puVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  static_huffman_data_model *model;
  bool bVar5;
  symbol_codec sStack_b8;
  
  symbol_codec::symbol_codec(&sStack_b8);
  symbol_codec::start_encoding(&sStack_b8,0x100000);
  uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                    (&sStack_b8,&this->m_reference_dm,false,(static_huffman_data_model *)0x0);
  if (uVar3 == 0) {
LAB_001522a8:
    bVar5 = false;
  }
  else {
    model = (static_huffman_data_model *)&this->field_0x2690;
    lVar4 = 2;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      if (model->m_total_syms != 0) {
        uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                          (&sStack_b8,model,false,(static_huffman_data_model *)0x0);
        if (uVar3 == 0) goto LAB_001522a8;
      }
      if (*(int *)&model[3].m_codes.m_p != 0) {
        uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                          (&sStack_b8,(static_huffman_data_model *)&model[3].m_codes,false,
                           (static_huffman_data_model *)0x0);
        if (uVar3 == 0) goto LAB_001522a8;
      }
      model = model + 1;
    }
    symbol_codec::stop_encoding(&sStack_b8,false);
    puVar1 = (this->m_packed_data_models).m_p;
    (this->m_packed_data_models).m_p = sStack_b8.m_output_buf.m_p;
    uVar2._0_4_ = (this->m_packed_data_models).m_size;
    uVar2._4_4_ = (this->m_packed_data_models).m_capacity;
    (this->m_packed_data_models).m_size = sStack_b8.m_output_buf.m_size;
    (this->m_packed_data_models).m_capacity = sStack_b8.m_output_buf.m_capacity;
    bVar5 = true;
    sStack_b8.m_output_buf.m_p = puVar1;
    sStack_b8.m_output_buf._8_8_ = uVar2;
  }
  symbol_codec::~symbol_codec(&sStack_b8);
  return bVar5;
}

Assistant:

bool crn_comp::pack_data_models() {
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);

  if (!codec.encode_transmit_static_huffman_data_model(m_reference_dm, false))
    return false;

  for (uint i = 0; i < 2; i++) {
    if (m_endpoint_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_endpoint_index_dm[i], false))
        return false;
    }

    if (m_selector_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_selector_index_dm[i], false))
        return false;
    }
  }

  codec.stop_encoding(false);

  m_packed_data_models.swap(codec.get_encoding_buf());

  return true;
}